

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_ref_t flatcc_builder_end_table(flatcc_builder_t *B)

{
  __flatcc_builder_frame_t *p_Var1;
  uint uVar2;
  flatcc_builder_vt_ref_t vt_ref;
  flatcc_builder_ref_t fVar3;
  flatbuffers_voffset_t vt_size;
  uint32_t vt_hash;
  flatcc_builder_ref_t fVar4;
  flatbuffers_voffset_t *pfVar5;
  uint uVar6;
  
  if (B->frame->type != 3) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x53b,"flatcc_builder_ref_t flatcc_builder_end_table(flatcc_builder_t *)");
  }
  pfVar5 = B->vs;
  uVar6 = *(int *)&B->id_end * 2 + 4;
  vt_size = (flatbuffers_voffset_t)uVar6;
  pfVar5[-2] = vt_size;
  if (B->ds_offset < 0xfffc) {
    uVar2 = B->ds_offset + 4;
    pfVar5[-1] = (flatbuffers_voffset_t)uVar2;
    uVar6 = uVar6 & 0xffff;
    vt_hash = (uVar2 & 0xffff ^ (B->vt_hash ^ uVar6) * -0x61c8864f) * -0x61c8864f;
    B->vt_hash = vt_hash;
    vt_ref = flatcc_builder_create_cached_vtable(B,pfVar5 + -2,vt_size,vt_hash);
    if (vt_ref == 0) {
      fVar4 = 0;
    }
    else {
      memset(pfVar5 + -2,0,(ulong)uVar6);
      pfVar5 = (flatbuffers_voffset_t *)
               ((ulong)(B->frame->container).table.pl_end + (long)B->buffers[3].iov_base);
      fVar3 = flatcc_builder_create_table
                        (B,B->ds,(ulong)B->ds_offset,B->align,pfVar5,
                         (int)((ulong)((long)B->pl - (long)pfVar5) >> 1),vt_ref);
      fVar4 = 0;
      if (fVar3 != 0) {
        p_Var1 = B->frame;
        B->vt_hash = (p_Var1->container).table.vt_hash;
        B->id_end = (p_Var1->container).table.id_end;
        B->vs = (flatbuffers_voffset_t *)
                ((ulong)(p_Var1->container).table.vs_end + (long)B->buffers[0].iov_base);
        B->pl = (flatbuffers_voffset_t *)
                ((ulong)(p_Var1->container).table.pl_end + (long)B->buffers[3].iov_base);
        exit_frame(B);
        fVar4 = fVar3;
      }
    }
    return fVar4;
  }
  __assert_fail("tsize <= (65535)",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x54e,"flatcc_builder_ref_t flatcc_builder_end_table(flatcc_builder_t *)");
}

Assistant:

flatcc_builder_ref_t flatcc_builder_end_table(flatcc_builder_t *B)
{
    voffset_t *vt, vt_size;
    flatcc_builder_ref_t table_ref, vt_ref;
    int pl_count;
    voffset_t *pl;
    size_t tsize;

    check(frame(type) == flatcc_builder_table, "expected table frame");

    /* We have `ds_limit`, so we should not have to check for overflow here. */

    vt = B->vs - 2;
    vt_size = (voffset_t)(sizeof(voffset_t) * (B->id_end + 2u));
    /* Update vtable header fields, first vtable size, then object table size. */
    vt[0] = vt_size;
    /*
     * The `ds` buffer is always at least `field_size` aligned but excludes the
     * initial vtable offset field. Therefore `field_size` is added here
     * to the total table size in the vtable.
     */
    tsize = (size_t)(B->ds_offset + field_size);
    /*
     * Tables are limited to 64K in standard FlatBuffers format due to the voffset
     * 16 bit size, but we must also be able to store the table size, so the
     * table payload has to be slightly less than that.
     */
    check(tsize <= FLATBUFFERS_VOFFSET_MAX, "table too large"); 
    vt[1] = (voffset_t)tsize;
    FLATCC_BUILDER_UPDATE_VT_HASH(B->vt_hash, (uint32_t)vt[0], (uint32_t)vt[1]);
    /* Find already emitted vtable, or emit a new one. */
    if (!(vt_ref = flatcc_builder_create_cached_vtable(B, vt, vt_size, B->vt_hash))) {
        return 0;
    }
    /* Clear vs stack so it is ready for the next vtable (ds stack is cleared by exit frame). */
    memset(vt, 0, vt_size);

    pl = pl_ptr(frame(container.table.pl_end));
    pl_count = (int)(B->pl - pl);
    if (0 == (table_ref = flatcc_builder_create_table(B, B->ds, B->ds_offset, B->align, pl, pl_count, vt_ref))) {
        return 0;
    }
    B->vt_hash = frame(container.table.vt_hash);
    B->id_end = frame(container.table.id_end);
    B->vs = vs_ptr(frame(container.table.vs_end));
    B->pl = pl_ptr(frame(container.table.pl_end));
    exit_frame(B);
    return table_ref;
}